

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall
cppjieba::Trie::Find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *res,size_t max_word_len)

{
  unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
  *this_00;
  uint32_t uVar1;
  bool bVar2;
  const_iterator pRVar3;
  reference pvVar4;
  pointer pvVar5;
  bool local_c9;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_b8;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_98;
  ulong local_90;
  size_t j;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_80;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_70;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_60;
  _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_50;
  unsigned_long local_48;
  size_t i;
  const_iterator citer;
  TrieNode *ptNode;
  size_t max_word_len_local;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *res_local;
  const_iterator end_local;
  const_iterator begin_local;
  Trie *this_local;
  
  if (this->root_ == (TrieNode *)0x0) {
    __assert_fail("root_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/Trie.hpp"
                  ,0x55,
                  "void cppjieba::Trie::Find(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<struct Dag> &, size_t) const"
                 );
  }
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::resize
            (res,((long)end - (long)begin) / 0x14);
  citer.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)
         (__node_type *)0x0;
  std::__detail::
  _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
              *)&i);
  local_48 = 0;
  do {
    if ((ulong)(((long)end - (long)begin) / 0x14) <= local_48) {
      return;
    }
    pRVar3 = begin + local_48;
    pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](res,local_48);
    uVar1 = pRVar3->offset;
    (pvVar4->runestr).rune = pRVar3->rune;
    (pvVar4->runestr).offset = uVar1;
    uVar1 = pRVar3->unicode_offset;
    (pvVar4->runestr).len = pRVar3->len;
    (pvVar4->runestr).unicode_offset = uVar1;
    (pvVar4->runestr).unicode_length = pRVar3->unicode_length;
    local_c9 = false;
    if (this->root_->next != (NextMap *)0x0) {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::end(this->root_->next);
      this_00 = this->root_->next;
      pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](res,local_48);
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::find(this_00,(key_type *)pvVar4);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
      _Node_const_iterator
                (&local_58,
                 (_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)&local_60);
      i = (size_t)local_58.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                  ._M_cur;
      local_c9 = std::__detail::operator!=
                           (&local_50,
                            (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                             *)&i);
    }
    if (local_c9 == false) {
      citer.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)
               (__node_type *)0x0;
    }
    else {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                             *)&i);
      citer.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)
               pvVar5->second;
    }
    if (citer.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
        _M_cur == (__node_type *)0x0) {
      pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](res,local_48);
      j = 0;
      std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::
      pair<unsigned_long_&,_const_cppjieba::DictUnit_*,_true>(&local_80,&local_48,(DictUnit **)&j);
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                (&pvVar4->nexts,&local_80);
      local_90 = local_48;
    }
    else {
      pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[](res,local_48);
      std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::pair<unsigned_long_&,_true>
                (&local_70,&local_48,
                 (DictUnit **)
                 ((long)citer.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                        ._M_cur + 8));
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                (&pvVar4->nexts,&local_70);
      local_90 = local_48;
    }
    while (((local_90 = local_90 + 1,
            local_90 < (ulong)(((long)end - (long)begin) / 0x14) &&
            (local_90 - local_48) + 1 <= max_word_len &&
            (citer.
             super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
             _M_cur != (__node_type *)0x0)) &&
           (*(long *)citer.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                     ._M_cur != 0))) {
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::find(*(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                    **)citer.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                       ._M_cur,&begin[local_90].rune);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)&local_98,
                 (_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)&local_a0);
      i = (size_t)local_98._M_cur;
      local_a8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::end(*(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                   **)citer.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                      ._M_cur);
      bVar2 = std::__detail::operator==
                        (&local_a8,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                          *)&i);
      if (bVar2) break;
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                             *)&i);
      citer.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)
               pvVar5->second;
      if ((((__node_type *)
           citer.
           super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
           _M_cur)->
          super__Hash_node_value<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>).
          super__Hash_node_value_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>.
          _M_storage._M_storage.__align != (anon_struct_8_0_00000001_for___align)0x0) {
        pvVar4 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                           (res,local_48);
        std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::pair<unsigned_long_&,_true>
                  (&local_b8,&local_90,
                   (DictUnit **)
                   ((long)citer.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                          ._M_cur + 8));
        limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                  (&pvVar4->nexts,&local_b8);
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void Find(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<struct Dag>&res, 
        size_t max_word_len = MAX_WORD_LENGTH) const {
    assert(root_ != NULL);
    res.resize(end - begin);

    const TrieNode *ptNode = NULL;
    TrieNode::NextMap::const_iterator citer;
    for (size_t i = 0; i < size_t(end - begin); i++) {
      res[i].runestr = *(begin + i);

      if (root_->next != NULL && root_->next->end() != (citer = root_->next->find(res[i].runestr.rune))) {
        ptNode = citer->second;
      } else {
        ptNode = NULL;
      }
      if (ptNode != NULL) {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, ptNode->ptValue));
      } else {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, static_cast<const DictUnit*>(NULL)));
      }

      for (size_t j = i + 1; j < size_t(end - begin) && (j - i + 1) <= max_word_len; j++) {
        if (ptNode == NULL || ptNode->next == NULL) {
          break;
        }
        citer = ptNode->next->find((begin + j)->rune);
        if (ptNode->next->end() == citer) {
          break;
        }
        ptNode = citer->second;
        if (NULL != ptNode->ptValue) {
          res[i].nexts.push_back(pair<size_t, const DictUnit*>(j, ptNode->ptValue));
        }
      }
    }
  }